

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::grow
          (MemoryBuffer<char,_500UL,_std::allocator<char>_> *this,size_t size)

{
  size_t __n;
  char *pcVar1;
  ulong uVar2;
  char *__dest;
  ulong uVar3;
  
  uVar3 = (this->super_Buffer<char>).capacity_;
  uVar3 = (uVar3 >> 1) + uVar3;
  if (uVar3 <= size) {
    uVar3 = size;
  }
  __dest = __gnu_cxx::new_allocator<char>::allocate((new_allocator<char> *)this,uVar3,(void *)0x0);
  __n = (this->super_Buffer<char>).size_;
  if (__n != 0) {
    memmove(__dest,(this->super_Buffer<char>).ptr_,__n);
  }
  pcVar1 = (this->super_Buffer<char>).ptr_;
  uVar2 = (this->super_Buffer<char>).capacity_;
  (this->super_Buffer<char>).capacity_ = uVar3;
  (this->super_Buffer<char>).ptr_ = __dest;
  if (pcVar1 != this->data_) {
    operator_delete(pcVar1,uVar2);
    return;
  }
  return;
}

Assistant:

void MemoryBuffer<T, SIZE, Allocator>::grow(std::size_t size) {
  std::size_t new_capacity = this->capacity_ + this->capacity_ / 2;
  if (size > new_capacity)
      new_capacity = size;
  T *new_ptr = this->allocate(new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(this->ptr_, this->ptr_ + this->size_,
                          make_ptr(new_ptr, new_capacity));
  std::size_t old_capacity = this->capacity_;
  T *old_ptr = this->ptr_;
  this->capacity_ = new_capacity;
  this->ptr_ = new_ptr;
  // deallocate may throw (at least in principle), but it doesn't matter since
  // the buffer already uses the new storage and will deallocate it in case
  // of exception.
  if (old_ptr != data_)
    Allocator::deallocate(old_ptr, old_capacity);
}